

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O0

int secp256k1_der_read_len(uchar **sigp,uchar *sigend)

{
  byte bVar1;
  byte *pbVar2;
  size_t ret;
  int b1;
  int lenleft;
  uchar *sigend_local;
  uchar **sigp_local;
  uint local_4;
  
  ret = 0;
  if (*sigp < sigend) {
    pbVar2 = *sigp;
    *sigp = pbVar2 + 1;
    bVar1 = *pbVar2;
    local_4 = (uint)bVar1;
    if (local_4 == 0xff) {
      local_4 = 0xffffffff;
    }
    else if ((bVar1 & 0x80) != 0) {
      if (local_4 == 0x80) {
        local_4 = 0xffffffff;
      }
      else {
        lenleft = local_4 & 0x7f;
        if ((long)sigend - (long)*sigp < (long)lenleft) {
          local_4 = 0xffffffff;
        }
        else if (**sigp == '\0') {
          local_4 = 0xffffffff;
        }
        else if ((uint)lenleft < 9) {
          for (; 0 < lenleft; lenleft = lenleft + -1) {
            ret = ret << 8 | (ulong)**sigp;
            if ((ulong)((long)sigend - (long)*sigp) < ret + (long)lenleft) {
              return -1;
            }
            *sigp = *sigp + 1;
          }
          if (ret < 0x80) {
            local_4 = 0xffffffff;
          }
          else {
            local_4 = (uint)ret;
          }
        }
        else {
          local_4 = 0xffffffff;
        }
      }
    }
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

static int secp256k1_der_read_len(const unsigned char **sigp, const unsigned char *sigend) {
    int lenleft, b1;
    size_t ret = 0;
    if (*sigp >= sigend) {
        return -1;
    }
    b1 = *((*sigp)++);
    if (b1 == 0xFF) {
        /* X.690-0207 8.1.3.5.c the value 0xFF shall not be used. */
        return -1;
    }
    if ((b1 & 0x80) == 0) {
        /* X.690-0207 8.1.3.4 short form length octets */
        return b1;
    }
    if (b1 == 0x80) {
        /* Indefinite length is not allowed in DER. */
        return -1;
    }
    /* X.690-207 8.1.3.5 long form length octets */
    lenleft = b1 & 0x7F;
    if (lenleft > sigend - *sigp) {
        return -1;
    }
    if (**sigp == 0) {
        /* Not the shortest possible length encoding. */
        return -1;
    }
    if ((size_t)lenleft > sizeof(size_t)) {
        /* The resulting length would exceed the range of a size_t, so
         * certainly longer than the passed array size.
         */
        return -1;
    }
    while (lenleft > 0) {
        ret = (ret << 8) | **sigp;
        if (ret + lenleft > (size_t)(sigend - *sigp)) {
            /* Result exceeds the length of the passed array. */
            return -1;
        }
        (*sigp)++;
        lenleft--;
    }
    if (ret < 128) {
        /* Not the shortest possible length encoding. */
        return -1;
    }
    return ret;
}